

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory_epoch.h
# Opt level: O1

void neatlib::epoch::
     MemoryEpoch<neatlib::LockFreeHashTable<unsigned_long,_unsigned_long,_std::hash<unsigned_long>,_4UL,_8UL>::Node,_std::vector<NodeQueue<neatlib::LockFreeHashTable<unsigned_long,_unsigned_long,_std::hash<unsigned_long>,_4UL,_8UL>::DataNode>,_std::allocator<NodeQueue<neatlib::LockFreeHashTable<unsigned_long,_unsigned_long,_std::hash<unsigned_long>,_4UL,_8UL>::DataNode>_>_>,_neatlib::LockFreeHashTable<unsigned_long,_unsigned_long,_std::hash<unsigned_long>,_4UL,_8UL>::DataNode>
     ::delete_callback(IAsyncContext *ctxt)

{
  pointer pNVar1;
  DataNode *pDVar2;
  DataNode *pDVar3;
  ulong uVar4;
  pointer __p;
  long in_FS_OFFSET;
  CallbackContext<neatlib::epoch::Delete_Context<neatlib::LockFreeHashTable<unsigned_long,_unsigned_long,_std::hash<unsigned_long>,_4UL,_8UL>::Node,_std::vector<NodeQueue<neatlib::LockFreeHashTable<unsigned_long,_unsigned_long,_std::hash<unsigned_long>,_4UL,_8UL>::DataNode>,_std::allocator<NodeQueue<neatlib::LockFreeHashTable<unsigned_long,_unsigned_long,_std::hash<unsigned_long>,_4UL,_8UL>::DataNode>_>_>_>_>
  context;
  _Head_base<0UL,_neatlib::epoch::Delete_Context<neatlib::LockFreeHashTable<unsigned_long,_unsigned_long,_std::hash<unsigned_long>,_4UL,_8UL>::Node,_std::vector<NodeQueue<neatlib::LockFreeHashTable<unsigned_long,_unsigned_long,_std::hash<unsigned_long>,_4UL,_8UL>::DataNode>,_std::allocator<NodeQueue<neatlib::LockFreeHashTable<unsigned_long,_unsigned_long,_std::hash<unsigned_long>,_4UL,_8UL>::DataNode>_>_>_>_*,_false>
  local_28;
  __uniq_ptr_impl<neatlib::epoch::Delete_Context<neatlib::LockFreeHashTable<unsigned_long,_unsigned_long,_std::hash<unsigned_long>,_4UL,_8UL>::Node,_std::vector<NodeQueue<neatlib::LockFreeHashTable<unsigned_long,_unsigned_long,_std::hash<unsigned_long>,_4UL,_8UL>::DataNode>,_std::allocator<NodeQueue<neatlib::LockFreeHashTable<unsigned_long,_unsigned_long,_std::hash<unsigned_long>,_4UL,_8UL>::DataNode>_>_>_>,_FASTER::core::ContextDeleter<neatlib::epoch::Delete_Context<neatlib::LockFreeHashTable<unsigned_long,_unsigned_long,_std::hash<unsigned_long>,_4UL,_8UL>::Node,_std::vector<NodeQueue<neatlib::LockFreeHashTable<unsigned_long,_unsigned_long,_std::hash<unsigned_long>,_4UL,_8UL>::DataNode>,_std::allocator<NodeQueue<neatlib::LockFreeHashTable<unsigned_long,_unsigned_long,_std::hash<unsigned_long>,_4UL,_8UL>::DataNode>_>_>_>_>_>
  local_20;
  
  local_28._M_head_impl =
       (Delete_Context<neatlib::LockFreeHashTable<unsigned_long,_unsigned_long,_std::hash<unsigned_long>,_4UL,_8UL>::Node,_std::vector<NodeQueue<neatlib::LockFreeHashTable<unsigned_long,_unsigned_long,_std::hash<unsigned_long>,_4UL,_8UL>::DataNode>,_std::allocator<NodeQueue<neatlib::LockFreeHashTable<unsigned_long,_unsigned_long,_std::hash<unsigned_long>,_4UL,_8UL>::DataNode>_>_>_>
        *)0x0;
  local_20._M_t.
  super__Tuple_impl<0UL,_neatlib::epoch::Delete_Context<neatlib::LockFreeHashTable<unsigned_long,_unsigned_long,_std::hash<unsigned_long>,_4UL,_8UL>::Node,_std::vector<NodeQueue<neatlib::LockFreeHashTable<unsigned_long,_unsigned_long,_std::hash<unsigned_long>,_4UL,_8UL>::DataNode>,_std::allocator<NodeQueue<neatlib::LockFreeHashTable<unsigned_long,_unsigned_long,_std::hash<unsigned_long>,_4UL,_8UL>::DataNode>_>_>_>_*,_FASTER::core::ContextDeleter<neatlib::epoch::Delete_Context<neatlib::LockFreeHashTable<unsigned_long,_unsigned_long,_std::hash<unsigned_long>,_4UL,_8UL>::Node,_std::vector<NodeQueue<neatlib::LockFreeHashTable<unsigned_long,_unsigned_long,_std::hash<unsigned_long>,_4UL,_8UL>::DataNode>,_std::allocator<NodeQueue<neatlib::LockFreeHashTable<unsigned_long,_unsigned_long,_std::hash<unsigned_long>,_4UL,_8UL>::DataNode>_>_>_>_>_>
  .
  super__Head_base<0UL,_neatlib::epoch::Delete_Context<neatlib::LockFreeHashTable<unsigned_long,_unsigned_long,_std::hash<unsigned_long>,_4UL,_8UL>::Node,_std::vector<NodeQueue<neatlib::LockFreeHashTable<unsigned_long,_unsigned_long,_std::hash<unsigned_long>,_4UL,_8UL>::DataNode>,_std::allocator<NodeQueue<neatlib::LockFreeHashTable<unsigned_long,_unsigned_long,_std::hash<unsigned_long>,_4UL,_8UL>::DataNode>_>_>_>_*,_false>
  ._M_head_impl =
       (tuple<neatlib::epoch::Delete_Context<neatlib::LockFreeHashTable<unsigned_long,_unsigned_long,_std::hash<unsigned_long>,_4UL,_8UL>::Node,_std::vector<NodeQueue<neatlib::LockFreeHashTable<unsigned_long,_unsigned_long,_std::hash<unsigned_long>,_4UL,_8UL>::DataNode>,_std::allocator<NodeQueue<neatlib::LockFreeHashTable<unsigned_long,_unsigned_long,_std::hash<unsigned_long>,_4UL,_8UL>::DataNode>_>_>_>_*,_FASTER::core::ContextDeleter<neatlib::epoch::Delete_Context<neatlib::LockFreeHashTable<unsigned_long,_unsigned_long,_std::hash<unsigned_long>,_4UL,_8UL>::Node,_std::vector<NodeQueue<neatlib::LockFreeHashTable<unsigned_long,_unsigned_long,_std::hash<unsigned_long>,_4UL,_8UL>::DataNode>,_std::allocator<NodeQueue<neatlib::LockFreeHashTable<unsigned_long,_unsigned_long,_std::hash<unsigned_long>,_4UL,_8UL>::DataNode>_>_>_>_>_>
        )(_Tuple_impl<0UL,_neatlib::epoch::Delete_Context<neatlib::LockFreeHashTable<unsigned_long,_unsigned_long,_std::hash<unsigned_long>,_4UL,_8UL>::Node,_std::vector<NodeQueue<neatlib::LockFreeHashTable<unsigned_long,_unsigned_long,_std::hash<unsigned_long>,_4UL,_8UL>::DataNode>,_std::allocator<NodeQueue<neatlib::LockFreeHashTable<unsigned_long,_unsigned_long,_std::hash<unsigned_long>,_4UL,_8UL>::DataNode>_>_>_>_*,_FASTER::core::ContextDeleter<neatlib::epoch::Delete_Context<neatlib::LockFreeHashTable<unsigned_long,_unsigned_long,_std::hash<unsigned_long>,_4UL,_8UL>::Node,_std::vector<NodeQueue<neatlib::LockFreeHashTable<unsigned_long,_unsigned_long,_std::hash<unsigned_long>,_4UL,_8UL>::DataNode>,_std::allocator<NodeQueue<neatlib::LockFreeHashTable<unsigned_long,_unsigned_long,_std::hash<unsigned_long>,_4UL,_8UL>::DataNode>_>_>_>_>_>
          )0x0;
  std::
  __uniq_ptr_impl<neatlib::epoch::Delete_Context<neatlib::LockFreeHashTable<unsigned_long,_unsigned_long,_std::hash<unsigned_long>,_4UL,_8UL>::Node,_std::vector<NodeQueue<neatlib::LockFreeHashTable<unsigned_long,_unsigned_long,_std::hash<unsigned_long>,_4UL,_8UL>::DataNode>,_std::allocator<NodeQueue<neatlib::LockFreeHashTable<unsigned_long,_unsigned_long,_std::hash<unsigned_long>,_4UL,_8UL>::DataNode>_>_>_>,_FASTER::core::ContextDeleter<neatlib::epoch::Delete_Context<neatlib::LockFreeHashTable<unsigned_long,_unsigned_long,_std::hash<unsigned_long>,_4UL,_8UL>::Node,_std::vector<NodeQueue<neatlib::LockFreeHashTable<unsigned_long,_unsigned_long,_std::hash<unsigned_long>,_4UL,_8UL>::DataNode>,_std::allocator<NodeQueue<neatlib::LockFreeHashTable<unsigned_long,_unsigned_long,_std::hash<unsigned_long>,_4UL,_8UL>::DataNode>_>_>_>_>_>
  ::reset((__uniq_ptr_impl<neatlib::epoch::Delete_Context<neatlib::LockFreeHashTable<unsigned_long,_unsigned_long,_std::hash<unsigned_long>,_4UL,_8UL>::Node,_std::vector<NodeQueue<neatlib::LockFreeHashTable<unsigned_long,_unsigned_long,_std::hash<unsigned_long>,_4UL,_8UL>::DataNode>,_std::allocator<NodeQueue<neatlib::LockFreeHashTable<unsigned_long,_unsigned_long,_std::hash<unsigned_long>,_4UL,_8UL>::DataNode>_>_>_>,_FASTER::core::ContextDeleter<neatlib::epoch::Delete_Context<neatlib::LockFreeHashTable<unsigned_long,_unsigned_long,_std::hash<unsigned_long>,_4UL,_8UL>::Node,_std::vector<NodeQueue<neatlib::LockFreeHashTable<unsigned_long,_unsigned_long,_std::hash<unsigned_long>,_4UL,_8UL>::DataNode>,_std::allocator<NodeQueue<neatlib::LockFreeHashTable<unsigned_long,_unsigned_long,_std::hash<unsigned_long>,_4UL,_8UL>::DataNode>_>_>_>_>_>
           *)&local_28,(pointer)ctxt);
  std::
  unique_ptr<neatlib::epoch::Delete_Context<neatlib::LockFreeHashTable<unsigned_long,_unsigned_long,_std::hash<unsigned_long>,_4UL,_8UL>::Node,_std::vector<NodeQueue<neatlib::LockFreeHashTable<unsigned_long,_unsigned_long,_std::hash<unsigned_long>,_4UL,_8UL>::DataNode>,_std::allocator<NodeQueue<neatlib::LockFreeHashTable<unsigned_long,_unsigned_long,_std::hash<unsigned_long>,_4UL,_8UL>::DataNode>_>_>_>,_FASTER::core::ContextDeleter<neatlib::epoch::Delete_Context<neatlib::LockFreeHashTable<unsigned_long,_unsigned_long,_std::hash<unsigned_long>,_4UL,_8UL>::Node,_std::vector<NodeQueue<neatlib::LockFreeHashTable<unsigned_long,_unsigned_long,_std::hash<unsigned_long>,_4UL,_8UL>::DataNode>,_std::allocator<NodeQueue<neatlib::LockFreeHashTable<unsigned_long,_unsigned_long,_std::hash<unsigned_long>,_4UL,_8UL>::DataNode>_>_>_>_>_>
  ::~unique_ptr((unique_ptr<neatlib::epoch::Delete_Context<neatlib::LockFreeHashTable<unsigned_long,_unsigned_long,_std::hash<unsigned_long>,_4UL,_8UL>::Node,_std::vector<NodeQueue<neatlib::LockFreeHashTable<unsigned_long,_unsigned_long,_std::hash<unsigned_long>,_4UL,_8UL>::DataNode>,_std::allocator<NodeQueue<neatlib::LockFreeHashTable<unsigned_long,_unsigned_long,_std::hash<unsigned_long>,_4UL,_8UL>::DataNode>_>_>_>,_FASTER::core::ContextDeleter<neatlib::epoch::Delete_Context<neatlib::LockFreeHashTable<unsigned_long,_unsigned_long,_std::hash<unsigned_long>,_4UL,_8UL>::Node,_std::vector<NodeQueue<neatlib::LockFreeHashTable<unsigned_long,_unsigned_long,_std::hash<unsigned_long>,_4UL,_8UL>::DataNode>,_std::allocator<NodeQueue<neatlib::LockFreeHashTable<unsigned_long,_unsigned_long,_std::hash<unsigned_long>,_4UL,_8UL>::DataNode>_>_>_>_>_>
                 *)&local_20);
  FASTER::core::Thread::id_::__tls_init();
  uVar4 = (ulong)*(uint *)(in_FS_OFFSET + -8);
  pNVar1 = ((local_28._M_head_impl)->pool->
           super__Vector_base<NodeQueue<neatlib::LockFreeHashTable<unsigned_long,_unsigned_long,_std::hash<unsigned_long>,_4UL,_8UL>::DataNode>,_std::allocator<NodeQueue<neatlib::LockFreeHashTable<unsigned_long,_unsigned_long,_std::hash<unsigned_long>,_4UL,_8UL>::DataNode>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  if (uVar4 <= (ulong)((long)((local_28._M_head_impl)->pool->
                             super__Vector_base<NodeQueue<neatlib::LockFreeHashTable<unsigned_long,_unsigned_long,_std::hash<unsigned_long>,_4UL,_8UL>::DataNode>,_std::allocator<NodeQueue<neatlib::LockFreeHashTable<unsigned_long,_unsigned_long,_std::hash<unsigned_long>,_4UL,_8UL>::DataNode>_>_>
                             )._M_impl.super__Vector_impl_data._M_finish - (long)pNVar1 >> 4)) {
    pDVar2 = (DataNode *)(local_28._M_head_impl)->ptr;
    pDVar3 = pNVar1[uVar4].head_;
    pDVar2->next = pDVar3;
    pDVar2->last = (DataNode *)0x0;
    if (pDVar3 == (DataNode *)0x0) {
      pNVar1[uVar4].tail_ = pDVar2;
      pDVar2->next = (DataNode *)0x0;
    }
    else {
      pDVar3->last = pDVar2;
    }
    pNVar1[uVar4].head_ = pDVar2;
    if (((local_28._M_head_impl)->super_IAsyncContext).from_deep_copy_ == false) {
      local_28._M_head_impl =
           (Delete_Context<neatlib::LockFreeHashTable<unsigned_long,_unsigned_long,_std::hash<unsigned_long>,_4UL,_8UL>::Node,_std::vector<NodeQueue<neatlib::LockFreeHashTable<unsigned_long,_unsigned_long,_std::hash<unsigned_long>,_4UL,_8UL>::DataNode>,_std::allocator<NodeQueue<neatlib::LockFreeHashTable<unsigned_long,_unsigned_long,_std::hash<unsigned_long>,_4UL,_8UL>::DataNode>_>_>_>
            *)0x0;
    }
    std::
    unique_ptr<neatlib::epoch::Delete_Context<neatlib::LockFreeHashTable<unsigned_long,_unsigned_long,_std::hash<unsigned_long>,_4UL,_8UL>::Node,_std::vector<NodeQueue<neatlib::LockFreeHashTable<unsigned_long,_unsigned_long,_std::hash<unsigned_long>,_4UL,_8UL>::DataNode>,_std::allocator<NodeQueue<neatlib::LockFreeHashTable<unsigned_long,_unsigned_long,_std::hash<unsigned_long>,_4UL,_8UL>::DataNode>_>_>_>,_FASTER::core::ContextDeleter<neatlib::epoch::Delete_Context<neatlib::LockFreeHashTable<unsigned_long,_unsigned_long,_std::hash<unsigned_long>,_4UL,_8UL>::Node,_std::vector<NodeQueue<neatlib::LockFreeHashTable<unsigned_long,_unsigned_long,_std::hash<unsigned_long>,_4UL,_8UL>::DataNode>,_std::allocator<NodeQueue<neatlib::LockFreeHashTable<unsigned_long,_unsigned_long,_std::hash<unsigned_long>,_4UL,_8UL>::DataNode>_>_>_>_>_>
    ::~unique_ptr((unique_ptr<neatlib::epoch::Delete_Context<neatlib::LockFreeHashTable<unsigned_long,_unsigned_long,_std::hash<unsigned_long>,_4UL,_8UL>::Node,_std::vector<NodeQueue<neatlib::LockFreeHashTable<unsigned_long,_unsigned_long,_std::hash<unsigned_long>,_4UL,_8UL>::DataNode>,_std::allocator<NodeQueue<neatlib::LockFreeHashTable<unsigned_long,_unsigned_long,_std::hash<unsigned_long>,_4UL,_8UL>::DataNode>_>_>_>,_FASTER::core::ContextDeleter<neatlib::epoch::Delete_Context<neatlib::LockFreeHashTable<unsigned_long,_unsigned_long,_std::hash<unsigned_long>,_4UL,_8UL>::Node,_std::vector<NodeQueue<neatlib::LockFreeHashTable<unsigned_long,_unsigned_long,_std::hash<unsigned_long>,_4UL,_8UL>::DataNode>,_std::allocator<NodeQueue<neatlib::LockFreeHashTable<unsigned_long,_unsigned_long,_std::hash<unsigned_long>,_4UL,_8UL>::DataNode>_>_>_>_>_>
                   *)&local_28);
    return;
  }
  __assert_fail("tid <= context->pool->size()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/huangjiahua[P]neatlib/./epoch/memory_epoch.h"
                ,0x29,
                "static void neatlib::epoch::MemoryEpoch<neatlib::LockFreeHashTable<unsigned long, unsigned long, std::hash<unsigned long>, 4, 8>::Node, std::vector<NodeQueue<neatlib::LockFreeHashTable<unsigned long, unsigned long, std::hash<unsigned long>, 4, 8>::DataNode>>, neatlib::LockFreeHashTable<unsigned long, unsigned long, std::hash<unsigned long>, 4, 8>::DataNode>::delete_callback(FASTER::core::IAsyncContext *) [T = neatlib::LockFreeHashTable<unsigned long, unsigned long, std::hash<unsigned long>, 4, 8>::Node, Pool = std::vector<NodeQueue<neatlib::LockFreeHashTable<unsigned long, unsigned long, std::hash<unsigned long>, 4, 8>::DataNode>>, Org = neatlib::LockFreeHashTable<unsigned long, unsigned long, std::hash<unsigned long>, 4, 8>::DataNode]"
               );
}

Assistant:

static void delete_callback(FASTER::core::IAsyncContext *ctxt) {
        FASTER::core::CallbackContext<Delete_Context<T, Pool>> context(ctxt);
        uint32_t tid = FASTER::core::Thread::id();
        assert(tid <= context->pool->size());
        auto &queue = context->pool->operator[](tid);
        queue.Push(static_cast<Org*>(context->ptr));
    }